

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void check_all_nodes_registered(EVmaster master)

{
  __time_t *p_Var1;
  anon_union_16_6_9efb12f0_for_u *paVar2;
  undefined8 *puVar3;
  uint uVar4;
  EVconfig_action_type EVar5;
  int iVar6;
  EVint_node_list p_Var7;
  _EVdfg_config_action *p_Var8;
  void *pvVar9;
  FILE *pFVar10;
  EVdfg_config_action act;
  EVdfg_config_action act_00;
  EVdfg_config_action act_01;
  EVdfg_config_action act_02;
  EVdfg_config_action act_03;
  EVdfg_config_action act_04;
  int iVar11;
  __pid_t _Var12;
  EVdfg_configuration p_Var13;
  EVdfg_configuration p_Var14;
  EVdfg_stone_state *pp_Var15;
  EVdfg_stone_state p_Var16;
  int *piVar17;
  char *pcVar18;
  char **ppcVar19;
  CMFormat format;
  EVmaster p_Var20;
  pthread_t pVar21;
  EVstone EVar22;
  EVdfg_stone_state extraout_RDX;
  long lVar23;
  CManager p_Var24;
  ulong uVar25;
  long lVar26;
  CMConnection p_Var27;
  EVdfg_stone_state p_Var28;
  attr_list in_R8;
  EVdfg dfg;
  long lVar29;
  long lVar30;
  long lVar31;
  EVmaster p_Var32;
  byte bVar33;
  EVready_msg msg_1;
  EVdfg_deploy_msg msg;
  timespec ts;
  undefined8 local_e8;
  undefined8 uStack_e0;
  anon_struct_8_2_24f754fc_for_period local_d8;
  char *pcStack_d0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined1 local_a8 [16];
  anon_union_40_5_866f0a8f_for_u local_98;
  CManager local_68;
  EVmaster local_60;
  EVmaster local_58;
  long local_50;
  long local_48;
  CMFormat local_40;
  long local_38;
  
  bVar33 = 0;
  if (master->node_join_handler == (EVmasterJoinHandlerFunc)0x0) {
    dfg = master->dfg;
    if (0 < (long)master->node_count) {
      lVar31 = 0;
      do {
        if ((*(int *)((long)&master->nodes->self + lVar31) == 0) &&
           (*(long *)((long)&master->nodes->conn + lVar31) == 0)) {
          return;
        }
        lVar31 = lVar31 + 0x38;
      } while ((long)master->node_count * 0x38 - lVar31 != 0);
    }
  }
  else {
    p_Var7 = master->nodes;
    iVar11 = master->node_count;
    IntCManager_unlock(master->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0xb35);
    (*master->node_join_handler)(master,p_Var7[(long)iVar11 + -1].name,(void *)0x0,(void *)0x0);
    IntCManager_lock(master->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0xb37);
    dfg = master->dfg;
    if (dfg == (EVdfg)0x0) {
      return;
    }
    if (dfg->realized == 0) {
      return;
    }
    if ((dfg->realized == 1) && (master->reconfig == 1)) {
      return;
    }
  }
  if (master->no_deployment == 0) {
    p_Var20 = dfg->master;
    if (p_Var20->sig_reconfig_bool == 0) {
      if (p_Var20->state != DFG_Joining) {
        __assert_fail("master->state == DFG_Joining",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                      ,0x9f1,"void perform_deployment(EVdfg)");
      }
      p_Var20->state = DFG_Starting;
      iVar11 = CMtrace_val[0xd];
      if (p_Var20->cm->CMTrace_file == (FILE *)0x0) {
        iVar11 = CMtrace_init(p_Var20->cm,EVdfgVerbose);
      }
      if (iVar11 != 0) {
        if (CMtrace_PID != 0) {
          pFVar10 = (FILE *)p_Var20->cm->CMTrace_file;
          _Var12 = getpid();
          pVar21 = pthread_self();
          fprintf(pFVar10,"P%lxT%lx - ",(long)_Var12,pVar21);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)local_a8);
          fprintf((FILE *)p_Var20->cm->CMTrace_file,"%lld.%.9ld - ",local_a8._0_8_,local_a8._8_8_);
        }
        fprintf((FILE *)p_Var20->cm->CMTrace_file,
                "EVDFG check all nodes registered -  master DFG state is %s\n",
                str_state[p_Var20->state]);
      }
      fflush((FILE *)p_Var20->cm->CMTrace_file);
      add_bridge_stones(dfg,dfg->working_state);
      dfg->deploy_ack_count = 0;
      if (dfg->deploy_ack_condition == -1) {
        iVar11 = INT_CMCondition_get(p_Var20->cm,(CMConnection)0x0);
        dfg->deploy_ack_condition = iVar11;
      }
      if (0 < dfg->master->node_count) {
        lVar26 = 0x30;
        lVar31 = 0;
        do {
          deploy_to_node(dfg,(int)lVar31,dfg->working_state);
          p_Var20 = dfg->master;
          *(undefined4 *)((long)&p_Var20->nodes->name + lVar26) = 1;
          lVar31 = lVar31 + 1;
          lVar26 = lVar26 + 0x38;
        } while (lVar31 < p_Var20->node_count);
      }
    }
    else {
      iVar11 = CMtrace_val[0xd];
      if (p_Var20->cm->CMTrace_file == (FILE *)0x0) {
        iVar11 = CMtrace_init(p_Var20->cm,EVdfgVerbose);
      }
      if (iVar11 != 0) {
        if (CMtrace_PID != 0) {
          pFVar10 = (FILE *)p_Var20->cm->CMTrace_file;
          _Var12 = getpid();
          pVar21 = pthread_self();
          fprintf(pFVar10,"P%lxT%lx - ",(long)_Var12,pVar21);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)local_a8);
          fprintf((FILE *)p_Var20->cm->CMTrace_file,"%lld.%.9ld - ",local_a8._0_8_,local_a8._8_8_);
        }
        fprintf((FILE *)p_Var20->cm->CMTrace_file,
                "EVDFG perform_deployment -  master DFG state set to %s\n",str_state[p_Var20->state]
               );
      }
      local_60 = master;
      fflush((FILE *)p_Var20->cm->CMTrace_file);
      if (p_Var20->state != DFG_Reconfiguring) {
        __assert_fail("master->state == DFG_Reconfiguring",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                      ,0x9ff,"void perform_deployment(EVdfg)");
      }
      p_Var13 = dfg->working_state;
      if (0 < p_Var13->pending_action_count) {
        p_Var32 = dfg->master;
        lVar31 = 0;
        do {
          p_Var8 = p_Var13->pending_action_queue + lVar31;
          local_a8._0_4_ = p_Var8->type;
          local_a8._4_4_ = p_Var8->stone_id;
          local_a8._8_8_ = *(undefined8 *)&p_Var8->node_for_action;
          paVar2 = &p_Var13->pending_action_queue[lVar31].u;
          local_98.node_join.node_name = (paVar2->bridge).action;
          local_98.node_join.contact_string = (char *)*(undefined8 *)((long)paVar2 + 8);
          p_Var16 = *p_Var13->stones;
          if (p_Var16->stone_id != p_Var8->stone_id) {
            lVar26 = 1;
            do {
              p_Var16 = p_Var13->stones[lVar26];
              lVar26 = lVar26 + 1;
            } while (p_Var16->stone_id != p_Var8->stone_id);
          }
          uVar4 = p_Var16->node;
          p_Var24 = p_Var32->cm;
          if (p_Var32->nodes[(int)uVar4].shutdown_status_contribution == -3) {
            iVar11 = CMtrace_val[0xd];
            if (p_Var24->CMTrace_file == (FILE *)0x0) {
              iVar11 = CMtrace_init(p_Var24,EVdfgVerbose);
            }
            if (iVar11 != 0) {
              printf("Skipping action because node failed -> ");
              act_00._8_8_ = local_a8._8_8_;
              act_00.type = local_a8._0_4_;
              act_00.stone_id = local_a8._4_4_;
              act_00.u.create.action =
                   (anon_struct_8_1_4c536f74_for_create)
                   (anon_struct_8_1_4c536f74_for_create)local_98.node_join.node_name;
              act_00.u._8_8_ = local_98.node_join.contact_string;
              fdump_dfg_config_action(p_Var32->cm->CMTrace_file,act_00);
            }
            p_Var13->pending_action_queue[lVar31].type = ACT_no_op;
          }
          else {
            iVar11 = CMtrace_val[0xd];
            if (p_Var24->CMTrace_file == (FILE *)0x0) {
              iVar11 = CMtrace_init(p_Var24,EVdfgVerbose);
            }
            if (iVar11 != 0) {
              fprintf((FILE *)p_Var32->cm->CMTrace_file,"Assigning action to node %d -> ",
                      (ulong)uVar4);
              act._8_8_ = local_a8._8_8_;
              act.type = local_a8._0_4_;
              act.stone_id = local_a8._4_4_;
              act.u.create.action =
                   (anon_struct_8_1_4c536f74_for_create)
                   (anon_struct_8_1_4c536f74_for_create)local_98.node_join.node_name;
              act.u._8_8_ = local_98.node_join.contact_string;
              fdump_dfg_config_action(p_Var32->cm->CMTrace_file,act);
            }
            p_Var13->pending_action_queue[lVar31].node_for_action = uVar4;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 < p_Var13->pending_action_count);
      }
      add_bridge_stones(dfg,dfg->working_state);
      p_Var13 = dfg->working_state;
      if (0 < p_Var13->stone_count) {
        lVar31 = 0;
        do {
          p_Var16 = p_Var13->stones[lVar31];
          if (p_Var16->condition == EVstone_Frozen) {
            local_a8._4_4_ = p_Var16->stone_id;
            local_a8._0_4_ = 0xb;
            local_a8._8_4_ = p_Var16->node;
            act_01._8_8_ = local_a8._8_8_;
            act_01.type = 0xb;
            act_01.stone_id = p_Var16->stone_id;
            act_01.u.create.action =
                 (anon_struct_8_1_4c536f74_for_create)
                 (anon_struct_8_1_4c536f74_for_create)local_98.node_join.node_name;
            act_01.u._8_8_ = local_98.node_join.contact_string;
            EVdfg_add_act_to_queue(p_Var13,act_01);
            p_Var16->condition = EVstone_Deployed;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 < p_Var13->stone_count);
      }
      iVar11 = CMtrace_val[0xd];
      if (p_Var20->cm->CMTrace_file == (FILE *)0x0) {
        iVar11 = CMtrace_init(p_Var20->cm,EVdfgVerbose);
      }
      if (iVar11 != 0) {
        fwrite("EVDFG pending actions to be done on nodes\n",0x2a,1,
               (FILE *)p_Var20->cm->CMTrace_file);
        p_Var13 = dfg->working_state;
        if (0 < p_Var13->pending_action_count) {
          lVar31 = 0;
          lVar26 = 0;
          do {
            puVar3 = (undefined8 *)((long)&p_Var13->pending_action_queue->u + lVar31);
            act_02.u.bridge.action = (char *)*puVar3;
            act_02._0_16_ =
                 *(undefined1 (*) [16])((long)&p_Var13->pending_action_queue->type + lVar31);
            act_02.u._8_8_ = puVar3[1];
            fdump_dfg_config_action(p_Var20->cm->CMTrace_file,act_02);
            lVar26 = lVar26 + 1;
            p_Var13 = dfg->working_state;
            lVar31 = lVar31 + 0x20;
          } while (lVar26 < p_Var13->pending_action_count);
        }
      }
      p_Var32 = dfg->master;
      lVar31 = (long)p_Var32->old_node_count;
      if (p_Var32->old_node_count < p_Var32->node_count) {
        do {
          deploy_to_node(dfg,(int)lVar31,dfg->working_state);
          dfg->master->nodes[lVar31].needs_ready = 1;
          p_Var13 = dfg->working_state;
          if (0 < p_Var13->pending_action_count) {
            lVar29 = 0;
            lVar26 = 0;
            do {
              p_Var1 = (__time_t *)((long)&p_Var13->pending_action_queue->type + lVar29);
              local_a8._0_8_ = *p_Var1;
              local_a8._8_8_ = p_Var1[1];
              puVar3 = (undefined8 *)((long)&p_Var13->pending_action_queue->u + lVar29);
              local_98.node_join.node_name = (char *)*puVar3;
              local_98.node_join.contact_string = (char *)puVar3[1];
              if (local_a8._8_4_ == (int)lVar31) {
                iVar11 = CMtrace_val[0xd];
                if (p_Var20->cm->CMTrace_file == (FILE *)0x0) {
                  iVar11 = CMtrace_init(p_Var20->cm,EVdfgVerbose);
                }
                if (iVar11 != 0) {
                  act_03._8_8_ = local_a8._8_8_;
                  act_03.type = (int)local_a8._0_8_;
                  act_03.stone_id = (int)((ulong)local_a8._0_8_ >> 0x20);
                  act_03.u.create.action =
                       (anon_struct_8_1_4c536f74_for_create)
                       (anon_struct_8_1_4c536f74_for_create)local_98.node_join.node_name;
                  act_03.u._8_8_ = local_98.node_join.contact_string;
                  fdump_dfg_config_action(p_Var20->cm->CMTrace_file,act_03);
                }
                *(undefined4 *)((long)&p_Var13->pending_action_queue->type + lVar29) = 0;
              }
              lVar26 = lVar26 + 1;
              lVar29 = lVar29 + 0x20;
            } while (lVar26 < p_Var13->pending_action_count);
          }
          lVar31 = lVar31 + 1;
          p_Var32 = dfg->master;
        } while (lVar31 < p_Var32->node_count);
      }
      p_Var13 = dfg->working_state;
      master = local_60;
      if (0 < p_Var13->pending_action_count) {
        p_Var24 = p_Var32->cm;
        local_50 = 4;
        lVar31 = 0;
        local_68 = p_Var24;
        local_58 = p_Var32;
        do {
          p_Var8 = p_Var13->pending_action_queue + lVar31;
          local_e8._0_4_ = p_Var8->type;
          local_e8._4_4_ = p_Var8->stone_id;
          uStack_e0 = *(undefined8 *)&p_Var8->node_for_action;
          paVar2 = &p_Var13->pending_action_queue[lVar31].u;
          local_d8 = paVar2->period;
          pcStack_d0 = (&paVar2->create)[1].action;
          iVar11 = CMtrace_val[0xd];
          if (p_Var24->CMTrace_file == (FILE *)0x0) {
            iVar11 = CMtrace_init(p_Var24,EVdfgVerbose);
          }
          if (iVar11 != 0) {
            act_04._8_8_ = uStack_e0;
            act_04.type = (int)local_e8;
            act_04.stone_id = (int)(local_e8 >> 0x20);
            act_04.u.period = local_d8;
            act_04.u._8_8_ = pcStack_d0;
            fdump_dfg_config_action(p_Var32->cm->CMTrace_file,act_04);
          }
          iVar11 = p_Var32->nodes[(int)uStack_e0].self;
          if (iVar11 == 0) {
            p_Var27 = p_Var32->nodes[(int)uStack_e0].conn;
          }
          else {
            p_Var27 = (CMConnection)0x0;
          }
          switch(local_e8 & 0xffffffff) {
          case 0:
          case 2:
          case 3:
          case 0xc:
            break;
          case 1:
          case 0xd:
            uVar4 = p_Var13->pending_action_queue[lVar31].node_for_action;
            lVar26 = (long)(int)uVar4;
            local_40 = INT_CMlookup_format(p_Var32->cm,EVdfg_deploy_format_list);
            iVar11 = CMtrace_val[0xd];
            if (p_Var32->cm->CMTrace_file == (FILE *)0x0) {
              iVar11 = CMtrace_init(p_Var32->cm,EVdfgVerbose);
            }
            if (iVar11 != 0) {
              if (CMtrace_PID != 0) {
                pFVar10 = (FILE *)p_Var32->cm->CMTrace_file;
                _Var12 = getpid();
                pVar21 = pthread_self();
                fprintf(pFVar10,"P%lxT%lx - ",(long)_Var12,pVar21);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,(timespec *)local_a8);
                fprintf((FILE *)p_Var32->cm->CMTrace_file,"%lld.%.9ld - ",local_a8._0_8_,
                        local_a8._8_8_);
              }
              fprintf((FILE *)p_Var32->cm->CMTrace_file,
                      "Master in deploy_msg_for_node for client %s, node %d\n",
                      p_Var32->nodes[lVar26].canonical_name,(ulong)uVar4);
            }
            fflush((FILE *)p_Var32->cm->CMTrace_file);
            local_b8._0_4_ = 0;
            local_b8._4_4_ = 0;
            local_38 = lVar26 * 0x38;
            local_c8._0_8_ = p_Var32->nodes[lVar26].canonical_name;
            local_c8._8_8_ = (EVdfg_stone_state *)0x0;
            local_b8 = INT_CMmalloc(0x40);
            lVar29 = lVar31;
            lVar30 = local_50;
            lVar23 = lVar26;
            if (lVar31 < p_Var13->pending_action_count) {
              do {
                local_48 = lVar23;
                p_Var8 = p_Var13->pending_action_queue;
                EVar5 = p_Var8[lVar29].type;
                p_Var16 = (EVdfg_stone_state)(ulong)(EVar5 - ACT_add_action);
                if ((10 < EVar5 - ACT_add_action) && (EVar5 != ACT_no_op)) {
                  iVar11 = p_Var8[lVar29].stone_id;
                  if ((EVar5 == ACT_create_bridge) || (EVar5 == ACT_create)) {
                    if (p_Var8[lVar29].node_for_action == (int)lVar26) {
                      if (0 < p_Var13->stone_count) {
                        lVar26 = 0;
                        do {
                          if (p_Var13->stones[lVar26]->stone_id == iVar11) {
                            add_stone_to_deploy_msg
                                      ((EVdfg_configuration)local_c8,
                                       (EVdfg_deploy_msg *)p_Var13->stones[lVar26],p_Var16);
                            p_Var16 = extraout_RDX;
                          }
                          lVar26 = lVar26 + 1;
                        } while (lVar26 < p_Var13->stone_count);
                      }
                      iVar6 = p_Var13->pending_action_count;
                      lVar26 = local_48;
                      if (lVar29 < iVar6) {
                        piVar17 = (int *)((long)&p_Var13->pending_action_queue->type + lVar30);
                        lVar23 = lVar29;
                        do {
                          if (*piVar17 == iVar11) {
                            piVar17[-1] = 0;
                          }
                          lVar23 = lVar23 + 1;
                          piVar17 = piVar17 + 8;
                        } while (lVar23 < iVar6);
                      }
                    }
                  }
                  else {
                    printf("Bad action type in build_deploy_msg_for_nodes (action type %d)\n");
                  }
                }
                lVar29 = lVar29 + 1;
                lVar30 = lVar30 + 0x20;
                lVar23 = local_48;
              } while (lVar29 < p_Var13->pending_action_count);
            }
            p_Var20 = local_58;
            master = local_60;
            p_Var7 = local_58->nodes;
            if (*(int *)((long)&p_Var7->needs_ready + local_38) == 0) {
              *(undefined4 *)((long)&p_Var7->needs_ready + local_38) = 1;
              piVar17 = &local_58->dfg->deploy_ack_count;
              *piVar17 = *piVar17 + -1;
            }
            p_Var27 = *(CMConnection *)((long)&p_Var7->conn + local_38);
            if (p_Var27 == (CMConnection)0x0) {
              IntCManager_unlock(local_58->cm,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                                 ,0x8d6);
              local_98.node_join.node_name = "master";
              dfg_deploy_handler(p_Var20->cm,(CMConnection)0x0,local_c8,p_Var20->client,in_R8);
              handle_deploy_ack(p_Var20,(EVmaster_msg_ptr)local_a8);
              IntCManager_lock(p_Var20->cm,
                               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                               ,0x8da);
            }
            else {
              INT_CMwrite(p_Var27,local_40,local_c8);
            }
            p_Var24 = local_68;
            if (0 < (int)local_c8._8_4_) {
              lVar26 = 0;
              lVar29 = 0;
              do {
                free(*(void **)((long)local_b8 + lVar26 + 0x20));
                pvVar9 = *(void **)((long)local_b8 + lVar26 + 8);
                if (pvVar9 != (void *)0x0) {
                  free(pvVar9);
                }
                pvVar9 = *(void **)((long)local_b8 + lVar26 + 0x38);
                if (pvVar9 != (void *)0x0) {
                  free(pvVar9);
                }
                lVar29 = lVar29 + 1;
                lVar26 = lVar26 + 0x40;
              } while (lVar29 < (int)local_c8._8_4_);
            }
            free(local_b8);
            p_Var32 = local_58;
            break;
          case 4:
            EVar22 = local_d8.usecs;
            if (iVar11 != 0) goto LAB_00147e99;
LAB_001481e7:
            INT_REVstone_set_output(p_Var27,local_e8._4_4_,local_d8.secs,EVar22);
            break;
          case 5:
            if (iVar11 == 0) {
              INT_REVstone_add_split_target(p_Var27,local_e8._4_4_,local_d8.usecs);
            }
            else {
              INT_EVstone_add_split_target(p_Var24,local_e8._4_4_,local_d8.usecs);
            }
            break;
          case 6:
            if (iVar11 == 0) {
              EVar22 = -1;
              goto LAB_001481e7;
            }
            EVar22 = -1;
LAB_00147e99:
            INT_EVstone_set_output(p_Var24,local_e8._4_4_,local_d8.secs,EVar22);
            break;
          case 7:
            if (iVar11 == 0) {
              INT_REVstone_remove_split_target(p_Var27,local_e8._4_4_,local_d8.usecs);
            }
            else {
              INT_EVstone_remove_split_target(p_Var24,local_e8._4_4_,local_d8.usecs);
            }
            break;
          case 8:
            if (iVar11 == 0) {
              INT_REVset_attr_list(p_Var27,local_e8._4_4_,(attr_list)local_d8);
            }
            else {
              INT_EVset_attr_list(p_Var24,local_e8._4_4_,(attr_list)local_d8);
            }
            break;
          case 9:
            if (iVar11 == 0) {
              INT_REVdestroy_stone(p_Var27,local_e8._4_4_);
            }
            else {
              INT_EVdestroy_stone(p_Var24,local_e8._4_4_);
            }
            break;
          case 10:
            if (iVar11 == 0) {
              INT_REVfreeze_stone(p_Var27,local_e8._4_4_);
            }
            else {
              INT_EVfreeze_stone(p_Var24,local_e8._4_4_);
            }
            break;
          case 0xb:
            if (iVar11 == 0) {
              INT_REVunfreeze_stone(p_Var27,local_e8._4_4_);
            }
            else {
              INT_EVunfreeze_stone(p_Var24,local_e8._4_4_);
            }
            break;
          default:
            printf("Bad action in perform_action_on_nodes %d\n");
          }
          lVar31 = lVar31 + 1;
          local_50 = local_50 + 0x20;
        } while (lVar31 < p_Var13->pending_action_count);
      }
      free(dfg->working_state->pending_action_queue);
      dfg->working_state->pending_action_queue = (_EVdfg_config_action *)0x0;
    }
    if ((dfg->deploy_ack_count != dfg->master->node_count) && (dfg->deploy_ack_condition != -1)) {
      IntCManager_unlock(dfg->master->cm,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                         ,0xa1a);
      CMCondition_wait(dfg->master->cm,dfg->deploy_ack_condition);
      IntCManager_lock(dfg->master->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0xa1c);
    }
  }
  master->no_deployment = 0;
  if (dfg->deployed_state != (EVdfg_configuration)0x0) {
    free_dfg_state(dfg->deployed_state);
  }
  p_Var13 = dfg->working_state;
  dfg->deployed_state = p_Var13;
  p_Var14 = (EVdfg_configuration)INT_CMmalloc(0x20);
  *(undefined8 *)p_Var14 = 0;
  p_Var14->stones = (EVdfg_stone_state *)0x0;
  *(undefined8 *)&p_Var14->pending_action_count = 0;
  p_Var14->pending_action_queue = (_EVdfg_config_action *)0x0;
  p_Var14->stone_count = p_Var13->stone_count;
  pp_Var15 = (EVdfg_stone_state *)INT_CMmalloc((long)p_Var13->stone_count << 3);
  p_Var14->stones = pp_Var15;
  if (0 < p_Var13->stone_count) {
    lVar31 = 0;
    do {
      p_Var16 = (EVdfg_stone_state)INT_CMmalloc(0x68);
      p_Var14->stones[lVar31] = p_Var16;
      p_Var16 = p_Var13->stones[lVar31];
      p_Var28 = p_Var14->stones[lVar31];
      for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
        iVar11 = p_Var16->bridge_stone;
        p_Var28->node = p_Var16->node;
        p_Var28->bridge_stone = iVar11;
        p_Var16 = (EVdfg_stone_state)((long)p_Var16 + (ulong)bVar33 * -0x10 + 8);
        p_Var28 = (EVdfg_stone_state)((long)p_Var28 + (ulong)bVar33 * -0x10 + 8);
      }
      if (p_Var13->stones[lVar31]->out_links != (int *)0x0) {
        piVar17 = (int *)INT_CMmalloc((long)p_Var13->stones[lVar31]->out_count << 2);
        pp_Var15 = p_Var14->stones;
        pp_Var15[lVar31]->out_links = piVar17;
        p_Var16 = pp_Var15[lVar31];
        memcpy(p_Var16->out_links,p_Var13->stones[lVar31]->out_links,(long)p_Var16->out_count << 2);
      }
      if (p_Var13->stones[lVar31]->in_links != (int *)0x0) {
        piVar17 = (int *)INT_CMmalloc((long)p_Var13->stones[lVar31]->in_count << 2);
        pp_Var15 = p_Var14->stones;
        pp_Var15[lVar31]->in_links = piVar17;
        p_Var16 = pp_Var15[lVar31];
        memcpy(p_Var16->in_links,p_Var13->stones[lVar31]->in_links,(long)p_Var16->in_count << 2);
      }
      pp_Var15 = p_Var13->stones;
      pcVar18 = pp_Var15[lVar31]->action;
      if (pcVar18 != (char *)0x0) {
        pcVar18 = strdup(pcVar18);
        p_Var14->stones[lVar31]->action = pcVar18;
      }
      p_Var16 = pp_Var15[lVar31];
      if (p_Var16->extra_actions != (char **)0x0) {
        ppcVar19 = (char **)INT_CMmalloc((long)p_Var16->action_count << 3);
        p_Var14->stones[lVar31]->extra_actions = ppcVar19;
        p_Var16 = p_Var13->stones[lVar31];
        if (1 < p_Var16->action_count) {
          lVar26 = 0;
          do {
            if (p_Var16->extra_actions[lVar26] != (char *)0x0) {
              pcVar18 = strdup(p_Var16->extra_actions[lVar26]);
              p_Var14->stones[lVar31]->extra_actions[lVar26] = pcVar18;
            }
            lVar26 = lVar26 + 1;
            p_Var16 = p_Var13->stones[lVar31];
          } while (lVar26 < (long)p_Var16->action_count + -1);
        }
      }
      if (p_Var13->stones[lVar31]->attrs != (attr_list)0x0) {
        add_ref_attr_list();
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < p_Var13->stone_count);
  }
  dfg->working_state = p_Var14;
  format = INT_CMlookup_format(dfg->master->cm,EVdfg_ready_format_list);
  p_Var24 = dfg->master->cm;
  iVar11 = CMtrace_val[0xd];
  if (p_Var24->CMTrace_file == (FILE *)0x0) {
    iVar11 = CMtrace_init(p_Var24,EVdfgVerbose);
  }
  if (iVar11 != 0) {
    if (CMtrace_PID != 0) {
      pFVar10 = (FILE *)dfg->master->cm->CMTrace_file;
      _Var12 = getpid();
      pVar21 = pthread_self();
      fprintf(pFVar10,"P%lxT%lx - ",(long)_Var12,pVar21);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)local_a8);
      fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",local_a8._0_8_,local_a8._8_8_);
    }
    fprintf((FILE *)dfg->master->cm->CMTrace_file,"Master signaling DFG %p ready for operation\n",
            dfg);
  }
  fflush((FILE *)dfg->master->cm->CMTrace_file);
  p_Var20 = dfg->master;
  if (0 < p_Var20->node_count) {
    lVar31 = 0;
    uVar25 = 0;
    do {
      p_Var7 = p_Var20->nodes;
      if (*(int *)((long)&p_Var7->needs_ready + lVar31) == 0) {
        iVar11 = CMtrace_val[0xd];
        if (p_Var20->cm->CMTrace_file == (FILE *)0x0) {
          iVar11 = CMtrace_init(p_Var20->cm,EVdfgVerbose);
        }
        if (iVar11 != 0) {
          if (CMtrace_PID != 0) {
            pFVar10 = (FILE *)dfg->master->cm->CMTrace_file;
            _Var12 = getpid();
            pVar21 = pthread_self();
            fprintf(pFVar10,"P%lxT%lx - ",(long)_Var12,pVar21);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)local_a8);
            fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",local_a8._0_8_,
                    local_a8._8_8_);
          }
          fprintf((FILE *)dfg->master->cm->CMTrace_file,
                  "Master - ready not required for node %d \"%s\"\n",uVar25 & 0xffffffff,
                  *(undefined8 *)((long)&dfg->master->nodes->name + lVar31));
        }
        fflush((FILE *)dfg->master->cm->CMTrace_file);
      }
      else {
        if (*(long *)((long)&p_Var7->conn + lVar31) == 0) {
          if (*(int *)((long)&p_Var7->self + lVar31) == 0) {
            printf("Failure, no connection, not self, node %d\n",uVar25 & 0xffffffff);
            exit(1);
          }
          pcVar18 = 
          "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
          ;
          IntCManager_unlock(p_Var20->cm,
                             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                             ,0xa39);
          local_e8 = CONCAT44(local_e8._4_4_,(int)uVar25);
          p_Var24 = dfg->master->cm;
          iVar11 = CMtrace_val[0xd];
          if (p_Var24->CMTrace_file == (FILE *)0x0) {
            pcVar18 = (char *)0xd;
            iVar11 = CMtrace_init(p_Var24,EVdfgVerbose);
          }
          if (iVar11 != 0) {
            if (CMtrace_PID != 0) {
              pFVar10 = (FILE *)dfg->master->cm->CMTrace_file;
              _Var12 = getpid();
              pVar21 = pthread_self();
              fprintf(pFVar10,"P%lxT%lx - ",(long)_Var12,pVar21);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)local_a8);
              fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",local_a8._0_8_,
                      local_a8._8_8_);
            }
            pcVar18 = "Master DFG %p is ready, local signalling %d\n";
            fprintf((FILE *)dfg->master->cm->CMTrace_file,
                    "Master DFG %p is ready, local signalling %d\n",dfg,
                    (ulong)(uint)dfg->client->ready_condition);
          }
          fflush((FILE *)dfg->master->cm->CMTrace_file);
          dfg_ready_handler(dfg->master->cm,(CMConnection)pcVar18,&local_e8,dfg->client,in_R8);
          IntCManager_lock(dfg->master->cm,
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                           ,0xa3d);
        }
        else {
          local_e8 = CONCAT44(local_e8._4_4_,(int)uVar25);
          INT_CMwrite(*(CMConnection *)((long)&p_Var7->conn + lVar31),format,&local_e8);
          p_Var24 = dfg->master->cm;
          iVar11 = CMtrace_val[0xd];
          if (p_Var24->CMTrace_file == (FILE *)0x0) {
            iVar11 = CMtrace_init(p_Var24,EVdfgVerbose);
          }
          if (iVar11 != 0) {
            if (CMtrace_PID != 0) {
              pFVar10 = (FILE *)dfg->master->cm->CMTrace_file;
              _Var12 = getpid();
              pVar21 = pthread_self();
              fprintf(pFVar10,"P%lxT%lx - ",(long)_Var12,pVar21);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)local_a8);
              fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",local_a8._0_8_,
                      local_a8._8_8_);
            }
            fprintf((FILE *)dfg->master->cm->CMTrace_file,"Master - ready sent to node %d \"%s\"\n",
                    uVar25 & 0xffffffff,*(undefined8 *)((long)&dfg->master->nodes->name + lVar31));
          }
          fflush((FILE *)dfg->master->cm->CMTrace_file);
        }
        *(undefined4 *)((long)&dfg->master->nodes->needs_ready + lVar31) = 0;
      }
      uVar25 = uVar25 + 1;
      p_Var20 = dfg->master;
      lVar31 = lVar31 + 0x38;
    } while ((long)uVar25 < (long)p_Var20->node_count);
  }
  dfg->deployed_stone_count = dfg->stone_count;
  master->old_node_count = master->node_count;
  return;
}

Assistant:

static void
check_all_nodes_registered(EVmaster master)
{
    int i;
    EVdfg dfg = master->dfg;
    if (master->node_join_handler != NULL) {
	EVint_node_list node = &master->nodes[master->node_count-1];
	CManager_unlock(master->cm);
	(master->node_join_handler)(master, node->name, NULL, NULL);
	CManager_lock(master->cm);
	dfg = master->dfg;
	if ((dfg == NULL) || (dfg->realized == 0) || 
	    (dfg->realized == 1 && master->reconfig == 1)) return;
    } else {
	/* must be static node list */
	for(i=0; i<master->node_count; i++) {
	    if (!master->nodes[i].self && (master->nodes[i].conn == NULL)) {
		return;
	    }
	}
    }
	
    if (master->no_deployment == 0) {
	perform_deployment(dfg);
	wait_for_deploy_acks(dfg);
    }
    master->no_deployment = 0;
    if (dfg->deployed_state) {
	free_dfg_state(dfg->deployed_state);
    }
    dfg->deployed_state = dfg->working_state;
    dfg->working_state = copy_dfg_state(dfg->deployed_state);
    
    signal_ready(dfg);
    dfg->deployed_stone_count = dfg->stone_count;
    master->old_node_count = master->node_count;
}